

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

bool __thiscall QDockAreaLayoutItem::expansive(QDockAreaLayoutItem *this,Orientation o)

{
  QLayoutItem *pQVar1;
  uint uVar2;
  bool bVar3;
  
  bVar3 = false;
  if (((this->flags & 1) == 0) && (bVar3 = false, this->placeHolderItem == (QPlaceHolderItem *)0x0))
  {
    pQVar1 = this->widgetItem;
    if (pQVar1 == (QLayoutItem *)0x0) {
      if (this->subinfo != (QDockAreaLayoutInfo *)0x0) {
        bVar3 = QDockAreaLayoutInfo::expansive(this->subinfo,o);
        return bVar3;
      }
      bVar3 = false;
    }
    else {
      uVar2 = (*pQVar1->_vptr_QLayoutItem[5])(pQVar1);
      bVar3 = (o & ~uVar2) == 0;
    }
  }
  return bVar3;
}

Assistant:

bool QDockAreaLayoutItem::expansive(Qt::Orientation o) const
{
    if ((flags & GapItem) || placeHolderItem != nullptr)
        return false;
    if (widgetItem != nullptr)
        return ((widgetItem->expandingDirections() & o) == o);
    if (subinfo != nullptr)
        return subinfo->expansive(o);
    return false;
}